

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

bool __thiscall CsvModelSerialiser::loadModel(CsvModelSerialiser *this,QIODevice *source)

{
  QFlags<QIODeviceBase::OpenModeFlag> QVar1;
  ulong uVar2;
  CsvModelSerialiserPrivate *this_00;
  QTextStream local_40 [8];
  QTextStream reader;
  CsvModelSerialiserPrivate *d;
  QIODevice *source_local;
  CsvModelSerialiser *this_local;
  
  if (source == (QIODevice *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = QIODevice::isOpen();
    if ((uVar2 & 1) == 0) {
      QVar1 = operator|(ReadOnly,Text);
      uVar2 = (**(code **)(*(long *)source + 0x68))(source,QVar1.i);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    uVar2 = QIODevice::isReadable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = d_func(this);
      if ((this_00->super_AbstractSingleRoleSerialiserPrivate).super_AbstractStringSerialiserPrivate
          .super_AbstractModelSerialiserPrivate.m_model == (QAbstractItemModel *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        QIODevice::setTextModeEnabled(SUB81(source,0));
        QTextStream::QTextStream(local_40,source);
        this_local._7_1_ = CsvModelSerialiserPrivate::readCsv(this_00,local_40);
        QTextStream::~QTextStream(local_40);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CsvModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly | QIODevice::Text))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(CsvModelSerialiser);

    if (!d->m_model)
        return false;
    source->setTextModeEnabled(true);
    QTextStream reader(source);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    return d->readCsv(reader);
}